

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.h
# Opt level: O0

_influence<unsigned_int,_float> * __thiscall
xray_re::xr_flexbuf::duplicate<xray_re::_influence<unsigned_int,float>>
          (xr_flexbuf *this,_influence<unsigned_int,_float> *source)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  _influence<unsigned_int,_float> *target;
  _influence<unsigned_int,_float> *local_88;
  _influence<unsigned_int,_float> *local_70;
  _influence<unsigned_int,_float> *source_local;
  xr_flexbuf *this_local;
  
  if (source == (_influence<unsigned_int,_float> *)0x0) {
    local_88 = (_influence<unsigned_int,_float> *)0x0;
  }
  else {
    uVar1 = this->m_size;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar3 = SUB168(auVar2 * ZEXT816(0x24),0);
    if (SUB168(auVar2 * ZEXT816(0x24),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    target = (_influence<unsigned_int,_float> *)operator_new__(uVar3);
    if (uVar1 != 0) {
      local_70 = target;
      do {
        _influence<unsigned_int,_float>::_influence(local_70);
        local_70 = local_70 + 1;
      } while (local_70 != target + uVar1);
    }
    local_88 = copy<xray_re::_influence<unsigned_int,float>>(this,source,target,this->m_size);
  }
  return local_88;
}

Assistant:

inline T* xr_flexbuf::duplicate(const T* source) const
{
	return source ? copy(source, new T[m_size], m_size) : 0;
}